

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmcp(fitsfile *gfptr,fitsfile *mfptr,long member,int cpopt,int *status)

{
  int iVar1;
  size_t sVar2;
  fitsfile *local_230;
  fitsfile *tmpfptr;
  char value [81];
  char local_1c8 [8];
  char keyname [81];
  char local_168 [8];
  char comment [73];
  char card [81];
  char local_b8 [8];
  char extname [71];
  char *local_68;
  char *incList [2];
  int local_4c;
  int local_48;
  int i;
  int hdutype;
  int hdunum;
  int keypos;
  int numkeys;
  int *status_local;
  long lStack_28;
  int cpopt_local;
  long member_local;
  fitsfile *mfptr_local;
  fitsfile *gfptr_local;
  
  hdunum = 0;
  hdutype = 0;
  i = 0;
  local_48 = 0;
  local_68 = "GRPID#";
  incList[0] = "GRPLC#";
  local_230 = (fitsfile *)0x0;
  if (*status != 0) {
    return *status;
  }
  _keypos = status;
  status_local._4_4_ = cpopt;
  lStack_28 = member;
  member_local = (long)mfptr;
  mfptr_local = gfptr;
  iVar1 = ffgmop(gfptr,member,&local_230,status);
  *_keypos = iVar1;
  if (*_keypos == 0) {
    iVar1 = ffgkys(local_230,"EXTNAME",local_b8,local_168,_keypos);
    *_keypos = iVar1;
    if (*_keypos == 0xca) {
      local_b8[0] = '\0';
      *_keypos = 0;
    }
    else if (*_keypos != 0) goto LAB_00216229;
    prepare_keyvalue(local_b8);
    iVar1 = fits_strcasecmp(local_b8,"GROUPING");
    if (iVar1 == 0) {
      iVar1 = ffgtcp(local_230,(fitsfile *)member_local,0,_keypos);
      *_keypos = iVar1;
    }
    else {
      iVar1 = ffcopy(local_230,(fitsfile *)member_local,0,_keypos);
      *_keypos = iVar1;
      ffgrec((fitsfile *)member_local,0,comment + 0x48,_keypos);
      while (*_keypos == 0) {
        iVar1 = ffgnxk((fitsfile *)member_local,&local_68,2,(char **)0x0,0,comment + 0x48,_keypos);
        *_keypos = iVar1;
        iVar1 = ffghps((fitsfile *)member_local,&hdunum,&hdutype,_keypos);
        *_keypos = iVar1;
        iVar1 = ffgkyn((fitsfile *)member_local,hdutype + -1,local_1c8,(char *)&tmpfptr,local_168,
                       _keypos);
        *_keypos = iVar1;
        iVar1 = ffgrec((fitsfile *)member_local,hdutype + -1,comment + 0x48,_keypos);
        *_keypos = iVar1;
        iVar1 = ffdkey((fitsfile *)member_local,local_1c8,_keypos);
        *_keypos = iVar1;
      }
      if (*_keypos == 0xca) {
        *_keypos = 0;
      }
      if (*_keypos != 0) goto LAB_00216229;
    }
    sVar2 = strlen(local_b8);
    if (sVar2 == 0) {
      iVar1 = ffghdn(local_230,&i);
      if (iVar1 == 1) {
        strcpy(local_b8,"PRIMARY");
        iVar1 = ffpkys((fitsfile *)member_local,"EXTNAME",local_b8,
                       "HDU was Formerly a Primary Array",_keypos);
        *_keypos = iVar1;
      }
      else {
        strcpy(local_b8,"DEFAULT");
        iVar1 = ffpkys((fitsfile *)member_local,"EXTNAME",local_b8,"default EXTNAME set by CFITSIO",
                       _keypos);
        *_keypos = iVar1;
      }
    }
    ffghdn((fitsfile *)member_local,&i);
    ffghdt((fitsfile *)member_local,&local_48,_keypos);
    iVar1 = ffmkyj((fitsfile *)member_local,"EXTVER",0,(char *)0x0,_keypos);
    *_keypos = iVar1;
    if (*_keypos == 0xca) {
      *_keypos = 0;
      iVar1 = ffgkys((fitsfile *)member_local,"EXTNAME",local_b8,local_168,_keypos);
      *_keypos = iVar1;
      iVar1 = ffikyj((fitsfile *)member_local,"EXTVER",0,"Extension version ID",_keypos);
      *_keypos = iVar1;
    }
    if (*_keypos == 0) {
      local_4c = 1;
      while (iVar1 = ffmnhd((fitsfile *)member_local,local_48,local_b8,local_4c,_keypos), iVar1 == 0
            ) {
        local_4c = local_4c + 1;
      }
      *_keypos = 0;
      ffmahd((fitsfile *)member_local,i,&local_48,_keypos);
      iVar1 = ffmkyj((fitsfile *)member_local,"EXTVER",(long)local_4c,(char *)0x0,_keypos);
      *_keypos = iVar1;
      if (status_local._4_4_ == 0) {
        iVar1 = ffgtam(mfptr_local,(fitsfile *)member_local,0,_keypos);
        *_keypos = iVar1;
      }
      else if (status_local._4_4_ != 1) {
        if (status_local._4_4_ == 2) {
          iVar1 = ffgmrm(mfptr_local,lStack_28,1,_keypos);
          *_keypos = iVar1;
          iVar1 = ffgtam(mfptr_local,(fitsfile *)member_local,0,_keypos);
          *_keypos = iVar1;
        }
        else {
          *_keypos = 0x15b;
          ffpmsg("Invalid value specified for the cmopt parameter (ffgmcp)");
        }
      }
    }
  }
LAB_00216229:
  if (local_230 != (fitsfile *)0x0) {
    ffclos(local_230,_keypos);
  }
  return *_keypos;
}

Assistant:

int ffgmcp(fitsfile *gfptr,  /* FITS file pointer to group                   */
	   fitsfile *mfptr,  /* FITS file pointer to new member
				FITS file                                    */
	   long      member, /* member ID (row num) within grouping table    */
	   int       cpopt,  /* code specifying copy options:
				OPT_MCP_ADD  (0) ==> add copied member to the
 				                     grouping table
				OPT_MCP_NADD (1) ==> do not add member copy to
				                     the grouping table
				OPT_MCP_REPL (2) ==> replace current member
				                     entry with member copy  */
	   int      *status) /* return status code                           */
	   
/*
  copy a member HDU of a grouping table to a new FITS file. The grouping table
  must be the CHDU of the FITS file pointed to by gfptr. The copy of the
  group member shall be appended to the end of the FITS file pointed to by
  mfptr. If the cpopt parameter is set to OPT_MCP_ADD then the copy of the 
  member is added to the grouping table as a new member, if OPT_MCP_NADD 
  then the copied member is not added to the grouping table, and if 
  OPT_MCP_REPL then the copied member is used to replace the original member.
  The copied member HDU also has its EXTVER value updated so that its
  combination of XTENSION, EXTNAME and EXVTER is unique within its new
  FITS file.
*/

{
  int numkeys = 0;
  int keypos  = 0;
  int hdunum  = 0;
  int hdutype = 0;
  int i;
  
  char *incList[] = {"GRPID#","GRPLC#"};
  char  extname[FLEN_VALUE];
  char  card[FLEN_CARD];
  char  comment[FLEN_COMMENT];
  char  keyname[FLEN_CARD];
  char  value[FLEN_CARD];

  fitsfile *tmpfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /* open the member HDU to be copied */

      *status = fits_open_member(gfptr,member,&tmpfptr,status);

      if(*status != 0) continue;

      /*
	if the member is a grouping table then copy it with a call to
	fits_copy_group() using the "copy only the grouping table" option

	if it is not a grouping table then copy the hdu with fits_copy_hdu()
	remove all GRPIDn and GRPLCn keywords, and update the EXTVER keyword
	value
      */

      /* get the member HDU's EXTNAME value */

      *status = fits_read_key_str(tmpfptr,"EXTNAME",extname,comment,status);

      /* if no EXTNAME value was found then set the extname to a null string */

      if(*status == KEY_NO_EXIST) 
	{
	  extname[0] = 0;
	  *status    = 0;
	}
      else if(*status != 0) continue;

      prepare_keyvalue(extname);

      /* if a grouping table then copy with fits_copy_group() */

      if(fits_strcasecmp(extname,"GROUPING") == 0)
	*status = fits_copy_group(tmpfptr,mfptr,OPT_GCP_GPT,status);
      else
	{
	  /* copy the non-grouping table HDU the conventional way */

	  *status = fits_copy_hdu(tmpfptr,mfptr,0,status);

	  ffgrec(mfptr,0,card,status);

	  /* delete all the GRPIDn and GRPLCn keywords in the copied HDU */

	  while(*status == 0)
	    {
	      *status = fits_find_nextkey(mfptr,incList,2,NULL,0,card,status);
	      *status = fits_get_hdrpos(mfptr,&numkeys,&keypos,status);  
	      /* SPR 1738 */
	      *status = fits_read_keyn(mfptr,keypos-1,keyname,value,
				       comment,status);
	      *status = fits_read_record(mfptr,keypos-1,card,status);
	      *status = fits_delete_key(mfptr,keyname,status);
	    }

	  if(*status == KEY_NO_EXIST) *status = 0;
	  if(*status != 0) continue;
	}

      /* 
	 if the member HDU does not have an EXTNAME keyword then add one
	 with a default value
      */

      if(strlen(extname) == 0)
	{
	  if(fits_get_hdu_num(tmpfptr,&hdunum) == 1)
	    {
	      strcpy(extname,"PRIMARY");
	      *status = fits_write_key_str(mfptr,"EXTNAME",extname,
					   "HDU was Formerly a Primary Array",
					   status);
	    }
	  else
	    {
	      strcpy(extname,"DEFAULT");
	      *status = fits_write_key_str(mfptr,"EXTNAME",extname,
					   "default EXTNAME set by CFITSIO",
					   status);
	    }
	}

      /* 
	 update the member HDU's EXTVER value (add it if not present)
      */

      fits_get_hdu_num(mfptr,&hdunum);
      fits_get_hdu_type(mfptr,&hdutype,status);

      /* set the EXTVER value to 0 for now */

      *status = fits_modify_key_lng(mfptr,"EXTVER",0,NULL,status);

      /* if the EXTVER keyword was not found then add it */

      if(*status == KEY_NO_EXIST)
	{
	  *status = 0;
	  *status = fits_read_key_str(mfptr,"EXTNAME",extname,comment,
				      status);
	  *status = fits_insert_key_lng(mfptr,"EXTVER",0,
					"Extension version ID",status);
	}

      if(*status != 0) continue;

      /* find the first available EXTVER value for the copied HDU */
 
      for(i = 1; fits_movnam_hdu(mfptr,hdutype,extname,i,status) == 0; ++i);

      *status = 0;

      fits_movabs_hdu(mfptr,hdunum,&hdutype,status);

      /* reset the copied member HDUs EXTVER value */

      *status = fits_modify_key_lng(mfptr,"EXTVER",(long)i,NULL,status);    

      /*
	perform member copy operations that are dependent upon the cpopt
	parameter value
      */

      switch(cpopt)
	{
	case OPT_MCP_ADD:

	  /*
	    add the copied member to the grouping table, leaving the
	    entry for the original member in place
	  */

	  *status = fits_add_group_member(gfptr,mfptr,0,status);

	  break;

	case OPT_MCP_NADD:

	  /*
	    nothing to do for this copy option
	  */

	  break;

	case OPT_MCP_REPL:

	  /*
	    remove the original member from the grouping table and add the
	    copied member in its place
	  */

	  *status = fits_remove_member(gfptr,member,OPT_RM_ENTRY,status);
	  *status = fits_add_group_member(gfptr,mfptr,0,status);

	  break;

	default:

	  *status = BAD_OPTION;
	  ffpmsg("Invalid value specified for the cmopt parameter (ffgmcp)");

	  break;
	}

    }while(0);
      
  if(tmpfptr != NULL) 
    {
      fits_close_file(tmpfptr,status);
    }

  return(*status);
}